

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O0

void dxil_spv::analyze_dxil_atomic_counter(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false> local_38;
  Value *local_30;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false> local_28;
  iterator itr;
  AccessTracking *tracking;
  CallInst *instruction_local;
  Impl *impl_local;
  
  itr.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>)
       (__node_type *)0x0;
  local_30 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
       ::find(&impl->llvm_value_to_uav_resource_index_map,&local_30);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
       ::end(&impl->llvm_value_to_uav_resource_index_map);
  bVar1 = std::__detail::operator!=(&local_28,&local_38);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>
                         *)&local_28);
    itr.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>)
           std::
           unordered_map<unsigned_int,_dxil_spv::Converter::Impl::AccessTracking,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>_>
           ::operator[](&impl->uav_access_tracking,&ppVar2->second);
  }
  if (itr.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
      _M_cur != (__node_type *)0x0) {
    *(undefined1 *)
     ((long)itr.
            super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
            _M_cur + 4) = 1;
  }
  return;
}

Assistant:

static void analyze_dxil_atomic_counter(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	Converter::Impl::AccessTracking *tracking = nullptr;

	auto itr = impl.llvm_value_to_uav_resource_index_map.find(instruction->getOperand(1));
	if (itr != impl.llvm_value_to_uav_resource_index_map.end())
		tracking = &impl.uav_access_tracking[itr->second];

	if (tracking)
		tracking->has_counter = true;
}